

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_0U>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_0U> *this,executor_function *f)

{
  bool bVar1;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *this_00;
  undefined1 *a;
  undefined1 local_50 [8];
  ptr p;
  std_fenced_block local_21;
  fenced_block b;
  function_type tmp;
  executor_function *f_local;
  basic_executor_type<std::allocator<void>,_0U> *this_local;
  
  if (((this->bits_ & 1) == 0) &&
     (bVar1 = detail::scheduler::can_dispatch(this->io_context_->impl_), bVar1)) {
    detail::executor_function::executor_function((executor_function *)&stack0xffffffffffffffe0,f);
    detail::std_fenced_block::std_fenced_block(&local_21,full);
    asio_handler_invoke_helpers::
    invoke<asio::detail::executor_function,asio::detail::executor_function>
              ((executor_function *)&stack0xffffffffffffffe0,
               (executor_function *)&stack0xffffffffffffffe0);
    p.p._0_4_ = 1;
    detail::std_fenced_block::~std_fenced_block(&local_21);
    detail::executor_function::~executor_function((executor_function *)&stack0xffffffffffffffe0);
    if ((int)p.p != 0) {
      return;
    }
  }
  a = &this->field_0x8;
  local_50 = (undefined1  [8])a;
  this_00 = detail::
            executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
            ::ptr::allocate((allocator<void> *)a);
  p.v = (void *)0x0;
  p.a = (allocator<void> *)this_00;
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::executor_op<asio::detail::executor_function>(this_00,f,(allocator<void> *)a);
  p.v = this_00;
  detail::scheduler::post_immediate_completion
            (this->io_context_->impl_,&this_00->super_scheduler_operation,
             SUB41((this->bits_ & 2) >> 1,0));
  p.v = (void *)0x0;
  p.a = (allocator<void> *)0x0;
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)local_50);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits_ & blocking_never) == 0 && io_context_->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      io_context_->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = { detail::addressof(allocator_),
      op::ptr::allocate(allocator_), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f), allocator_);

  ASIO_HANDLER_CREATION((*io_context_, *p.p,
        "io_context", io_context_, 0, "execute"));

  io_context_->impl_.post_immediate_completion(p.p,
      (bits_ & relationship_continuation) != 0);
  p.v = p.p = 0;
}